

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.cpp
# Opt level: O2

wstring * __thiscall
PDA::Utils::Misc::toBase64_abi_cxx11_
          (wstring *__return_storage_ptr__,Misc *this,uchar *buffer,size_t size)

{
  pointer pwVar1;
  sbyte sVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  Misc *pMVar7;
  bool bVar8;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::wstring::_M_construct
            ((ulong)__return_storage_ptr__,(int)((ulong)(buffer + 2) / 3) * 4);
  pwVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
  pMVar7 = this + 1;
  lVar4 = 1;
  uVar3 = (ulong)buffer / 3;
  while (bVar8 = uVar3 != 0, uVar3 = uVar3 - 1, bVar8) {
    pwVar1[lVar4 + -1] =
         *(wchar_t *)
          ((long)L"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/" +
          (ulong)((byte)pMVar7[-1] & 0xfffffffc));
    pwVar1[lVar4] =
         L"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
         [((byte)pMVar7[-1] & 3) << 4 | (uint)((byte)*pMVar7 >> 4)];
    pwVar1[lVar4 + 1] =
         L"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
         [(uint)((byte)pMVar7[1] >> 6) + ((byte)*pMVar7 & 0xf) * 4];
    pwVar1[lVar4 + 2] =
         L"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[(byte)pMVar7[1] & 0x3f]
    ;
    pMVar7 = pMVar7 + 3;
    lVar4 = lVar4 + 4;
  }
  if ((ulong)buffer % 3 == 1) {
    pMVar7 = pMVar7 + -1;
    lVar6 = lVar4 + -1;
    uVar3 = (ulong)((byte)*pMVar7 >> 2);
    uVar5 = 0x30;
    sVar2 = 4;
  }
  else {
    if ((ulong)buffer % 3 != 2) {
      return __return_storage_ptr__;
    }
    pwVar1[lVar4 + -1] =
         *(wchar_t *)
          ((long)L"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/" +
          (ulong)((byte)pMVar7[-1] & 0xfffffffc));
    uVar3 = (ulong)(((byte)pMVar7[-1] & 3) << 4 | (uint)((byte)*pMVar7 >> 4));
    uVar5 = 0x3c;
    sVar2 = 2;
    lVar6 = lVar4;
  }
  pwVar1[lVar6] = L"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[uVar3];
  pwVar1[(long)(buffer + ((ulong)buffer / 3) * -3 + lVar4 + -1)] =
       L"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
       [uVar5 & (uint)(byte)*pMVar7 << sVar2];
  return __return_storage_ptr__;
}

Assistant:

std::wstring Misc::toBase64(unsigned char const* buffer, size_t size){
    using std::wstring;
    static wchar_t const* base64Table =
        L"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/";

    size_t base64Size = (size + 2 - ((size + 2) % 3)) / 3 * 4;
    wstring result(base64Size, L'A');

    unsigned char const* s = buffer;  // source pointer
    size_t di = 0;                    // destination index
    for(size_t i = 0; i < size / 3; i++){
        // input: 0000_0000 0000_0000 0000_0000
        //
        // out1:  0000_00
        // out2:         00 0000
        // out3:                _0000 00
        // out4:                        00_0000

        result[di++] = base64Table[s[0] >> 2];
        result[di++] = base64Table[((s[0] << 4) | (s[1] >> 4)) & 0x3f];
        result[di++] = base64Table[((s[1] << 2) | (s[2] >> 6)) & 0x3f];
        result[di++] = base64Table[s[2] & 0x3f];
        s += 3;
    }

    size_t remainSize = size % 3;
    switch(remainSize){
    case 0:
        break;
    case 1:
        result[di++] = base64Table[s[0] >> 2];
        result[di++] = base64Table[(s[0] << 4) & 0x3f];
        break;
    case 2:
        result[di++] = base64Table[s[0] >> 2];
        result[di++] = base64Table[((s[0] << 4) | (s[1] >> 4)) & 0x3f];
        result[di++] = base64Table[(s[1] << 2) & 0x3f];
        break;
    }
    return result;
}